

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolver.c
# Opt level: O0

uint xSAT_SolverPropagate(xSAT_Solver_t *s)

{
  uint uVar1;
  int iVar2;
  Vec_Str_t *pVVar3;
  xSAT_VecWatchList_t *v;
  xSAT_Clause_t xVar4;
  xSAT_Watcher_t e;
  xSAT_Clause_t xVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  xSAT_WatchList_t *pxVar12;
  xSAT_Watcher_t *pxVar13;
  xSAT_Clause_t *pxVar14;
  xSAT_Clause_t *pxVar15;
  xSAT_WatchList_t *v_00;
  int *local_80;
  int *k;
  int *stop;
  xSAT_Watcher_t w;
  xSAT_Clause_t *pCla;
  xSAT_Watcher_t *j;
  xSAT_Watcher_t *i;
  xSAT_Watcher_t *end;
  xSAT_Watcher_t *begin;
  xSAT_WatchList_t *ws;
  int local_30;
  int p;
  int nProp;
  int NegLit;
  int *Lits;
  uint hConfl;
  xSAT_Solver_t *s_local;
  
  Lits._4_4_ = 0xffffffff;
  local_30 = 0;
  do {
    iVar8 = s->iQhead;
    iVar7 = Vec_IntSize(s->vTrail);
    if (iVar7 <= iVar8) {
      (s->Stats).nPropagations = (long)local_30 + (s->Stats).nPropagations;
      s->nPropSimplify = s->nPropSimplify - (long)local_30;
      return Lits._4_4_;
    }
    iVar8 = s->iQhead;
    s->iQhead = iVar8 + 1;
    iVar8 = Vec_IntEntry(s->vTrail,iVar8);
    pxVar12 = xSAT_VecWatchListEntry(s->vBinWatches,iVar8);
    j = xSAT_WatchListArray(pxVar12);
    iVar7 = xSAT_WatchListSize(pxVar12);
    pxVar13 = j + iVar7;
    local_30 = local_30 + 1;
    for (; j < pxVar13; j = j + 1) {
      pVVar3 = s->vAssigns;
      iVar7 = xSAT_Lit2Var(j->Blocker);
      cVar6 = Vec_StrEntry(pVVar3,iVar7);
      if (cVar6 == '\x03') {
        xSAT_SolverEnqueue(s,j->Blocker,j->CRef);
      }
      else {
        pVVar3 = s->vAssigns;
        iVar7 = xSAT_Lit2Var(j->Blocker);
        cVar6 = Vec_StrEntry(pVVar3,iVar7);
        iVar7 = xSAT_NegLit(j->Blocker);
        iVar7 = xSAT_LitSign(iVar7);
        if (cVar6 == iVar7) {
          return j->CRef;
        }
      }
    }
    pxVar12 = xSAT_VecWatchListEntry(s->vWatches,iVar8);
    pxVar13 = xSAT_WatchListArray(pxVar12);
    iVar7 = xSAT_WatchListSize(pxVar12);
    pCla = (xSAT_Clause_t *)pxVar13;
    j = pxVar13;
    while (j < pxVar13 + iVar7) {
      pVVar3 = s->vAssigns;
      iVar9 = xSAT_Lit2Var(j->Blocker);
      cVar6 = Vec_StrEntry(pVVar3,iVar9);
      iVar9 = xSAT_LitSign(j->Blocker);
      if (cVar6 == iVar9) {
        *pCla = (xSAT_Clause_t)*j;
        pCla = pCla + 1;
        j = j + 1;
      }
      else {
        pxVar14 = xSAT_SolverReadClause(s,j->CRef);
        pxVar15 = pxVar14 + 1;
        iVar9 = xSAT_NegLit(iVar8);
        if (*(int *)pxVar15 == iVar9) {
          *(int *)pxVar15 = pxVar14[1].nSize;
          pxVar14[1].nSize = iVar9;
        }
        if (pxVar14[1].nSize != iVar9) {
          __assert_fail("Lits[1] == NegLit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatSolver.c"
                        ,0x2c9,"unsigned int xSAT_SolverPropagate(xSAT_Solver_t *)");
        }
        uVar1 = j->CRef;
        iVar2 = *(int *)pxVar15;
        if (*(int *)pxVar15 == j->Blocker) {
LAB_00bd3ccb:
          iVar10 = pxVar14->nSize;
          for (local_80 = (int *)(pxVar14 + 2);
              local_80 < (xSAT_Clause_t *)((long)&pxVar15->field_0x0 + (long)iVar10 * 4);
              local_80 = local_80 + 1) {
            pVVar3 = s->vAssigns;
            iVar11 = xSAT_Lit2Var(*local_80);
            cVar6 = Vec_StrEntry(pVVar3,iVar11);
            iVar11 = xSAT_LitSign(*local_80);
            if ((int)cVar6 != (uint)((iVar11 != 0 ^ 0xffU) & 1)) {
              pxVar14[1].nSize = *local_80;
              *local_80 = iVar9;
              v = s->vWatches;
              iVar9 = xSAT_NegLit(pxVar14[1].nSize);
              v_00 = xSAT_VecWatchListEntry(v,iVar9);
              e.Blocker = iVar2;
              e.CRef = uVar1;
              xSAT_WatchListPush(v_00,e);
              goto LAB_00bd3e91;
            }
          }
          xVar5.nSize = iVar2;
          xVar5._0_4_ = uVar1;
          *pCla = xVar5;
          pVVar3 = s->vAssigns;
          iVar9 = xSAT_Lit2Var(*(int *)pxVar15);
          cVar6 = Vec_StrEntry(pVVar3,iVar9);
          iVar9 = xSAT_NegLit(*(int *)pxVar15);
          iVar9 = xSAT_LitSign(iVar9);
          if (cVar6 == iVar9) {
            Lits._4_4_ = j->CRef;
            iVar9 = Vec_IntSize(s->vTrail);
            s->iQhead = iVar9;
            pCla = pCla + 1;
            while (j = j + 1, j < pxVar13 + iVar7) {
              *pCla = (xSAT_Clause_t)*j;
              pCla = pCla + 1;
            }
          }
          else {
            xSAT_SolverEnqueue(s,*(int *)pxVar15,j->CRef);
            pCla = pCla + 1;
          }
        }
        else {
          pVVar3 = s->vAssigns;
          iVar10 = xSAT_Lit2Var(*(int *)pxVar15);
          cVar6 = Vec_StrEntry(pVVar3,iVar10);
          iVar10 = xSAT_LitSign(*(int *)pxVar15);
          if (cVar6 != iVar10) goto LAB_00bd3ccb;
          xVar4.nSize = iVar2;
          xVar4._0_4_ = uVar1;
          *pCla = xVar4;
          pCla = pCla + 1;
        }
LAB_00bd3e91:
        j = j + 1;
      }
    }
    pxVar13 = xSAT_WatchListArray(pxVar12);
    (s->Stats).nInspects = ((long)pCla - (long)pxVar13 >> 3) + (s->Stats).nInspects;
    pxVar13 = xSAT_WatchListArray(pxVar12);
    xSAT_WatchListShrink(pxVar12,(int)((long)pCla - (long)pxVar13 >> 3));
  } while( true );
}

Assistant:

unsigned xSAT_SolverPropagate( xSAT_Solver_t* s )
{
    unsigned hConfl = CRefUndef;
    int * Lits;
    int NegLit;
    int nProp = 0;

    while ( s->iQhead < Vec_IntSize( s->vTrail ) )
    {
        int p = Vec_IntEntry( s->vTrail, s->iQhead++ );
        xSAT_WatchList_t* ws = xSAT_VecWatchListEntry( s->vBinWatches, p );
        xSAT_Watcher_t* begin = xSAT_WatchListArray( ws );
        xSAT_Watcher_t* end   = begin + xSAT_WatchListSize( ws );
        xSAT_Watcher_t *i, *j;

        nProp++;
        for ( i = begin; i < end; i++ )
        {
            if ( Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( i->Blocker ) ) == VarX )
                xSAT_SolverEnqueue( s, i->Blocker, i->CRef );
            else if ( Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( i->Blocker ) ) == xSAT_LitSign( xSAT_NegLit( i->Blocker ) ) )
                return i->CRef;
        }

        ws    = xSAT_VecWatchListEntry( s->vWatches, p );
        begin = xSAT_WatchListArray( ws );
        end   = begin + xSAT_WatchListSize( ws );

        for ( i = j = begin; i < end; )
        {
            xSAT_Clause_t * pCla;
            xSAT_Watcher_t w;
            if ( Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( i->Blocker ) ) == xSAT_LitSign( i->Blocker ) )
            {
                *j++ = *i++;
                continue;
            }

            pCla = xSAT_SolverReadClause( s, i->CRef );
            Lits = &( pCla->pData[0].Lit );

            // Make sure the false literal is data[1]:
            NegLit = xSAT_NegLit( p );
            if ( Lits[0] == NegLit )
            {
                Lits[0] = Lits[1];
                Lits[1] = NegLit;
            }
            assert( Lits[1] == NegLit );

            w.CRef = i->CRef;
            w.Blocker = Lits[0];

            // If 0th watch is true, then clause is already satisfied.
            if ( Lits[0] != i->Blocker && Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( Lits[0] ) ) == xSAT_LitSign( Lits[0] ) )
                *j++ = w;
            else
            {
                // Look for new watch:
                int * stop = Lits + pCla->nSize;
                int * k;
                for ( k = Lits + 2; k < stop; k++ )
                {
                    if (Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( *k ) ) != !xSAT_LitSign( *k ) )
                    {
                        Lits[1] = *k;
                        *k = NegLit;
                        xSAT_WatchListPush( xSAT_VecWatchListEntry( s->vWatches, xSAT_NegLit( Lits[1] ) ), w );
                        goto next;
                    }
                }

                *j++ = w;

                // Clause is unit under assignment:
                if (Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( Lits[0] ) ) == xSAT_LitSign( xSAT_NegLit( Lits[0] ) ) )
                {
                    hConfl = i->CRef;
                    i++;
                    s->iQhead = Vec_IntSize( s->vTrail );
                    // Copy the remaining watches:
                    while (i < end)
                        *j++ = *i++;
                }
                else
                    xSAT_SolverEnqueue( s, Lits[0], i->CRef );
            }
        next:
            i++;
        }

        s->Stats.nInspects += j - xSAT_WatchListArray( ws );
        xSAT_WatchListShrink( ws, j - xSAT_WatchListArray( ws ) );
    }

    s->Stats.nPropagations += nProp;
    s->nPropSimplify -= nProp;

    return hConfl;
}